

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdsmf.c
# Opt level: O0

int it_riff_dsmf_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  int value;
  long lVar4;
  void *pvVar5;
  int in_EDX;
  DUMBFILE *in_RSI;
  undefined4 *in_RDI;
  IT_ENTRY *entry;
  int r;
  int q;
  int p;
  long end;
  long start;
  uint flags;
  int row;
  int length;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar7;
  long in_stack_ffffffffffffffb0;
  DUMBFILE *f_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_24;
  int local_4;
  
  iVar1 = dumbfile_igetw((DUMBFILE *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  if (in_EDX < iVar1) {
    local_4 = -1;
  }
  else {
    *in_RDI = 0x40;
    in_RDI[1] = 0x40;
    local_24 = 0;
    iVar2 = dumbfile_pos(in_RSI);
    lVar4 = (long)iVar2 + (long)(iVar1 + -2);
    while( true ) {
      uVar7 = false;
      if (local_24 < 0x40) {
        iVar1 = dumbfile_error(in_RSI);
        uVar7 = false;
        if (iVar1 == 0) {
          iVar2 = dumbfile_pos(in_RSI);
          uVar7 = iVar2 < lVar4;
        }
      }
      if ((bool)uVar7 == false) break;
      uVar3 = dumbfile_getc((DUMBFILE *)
                            CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                    in_stack_ffffffffffffffa8)));
      if (uVar3 == 0) {
        local_24 = local_24 + 1;
      }
      else if ((uVar3 & 0xf0) != 0) {
        in_RDI[1] = in_RDI[1] + 1;
        if ((uVar3 & 0x80) != 0) {
          dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb0);
        }
        if ((uVar3 & 0x40) != 0) {
          dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb0);
        }
        if ((uVar3 & 0x20) != 0) {
          dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb0);
        }
        if ((uVar3 & 0x10) != 0) {
          dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb0);
        }
      }
    }
    if (in_RDI[1] == 0x40) {
      local_4 = 0;
    }
    else {
      pvVar5 = malloc((long)(int)in_RDI[1] * 7);
      *(void **)(in_RDI + 2) = pvVar5;
      if (*(long *)(in_RDI + 2) == 0) {
        local_4 = -1;
      }
      else {
        f_00 = *(DUMBFILE **)(in_RDI + 2);
        local_24 = 0;
        iVar1 = dumbfile_seek(f_00,CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                           in_stack_ffffffffffffffa8)),0);
        if (iVar1 == 0) {
          while( true ) {
            uVar6 = false;
            if (local_24 < 0x40) {
              iVar1 = dumbfile_error(in_RSI);
              uVar6 = false;
              if (iVar1 == 0) {
                iVar2 = dumbfile_pos(in_RSI);
                uVar6 = iVar2 < lVar4;
              }
            }
            if ((bool)uVar6 == false) break;
            uVar3 = dumbfile_getc((DUMBFILE *)
                                  CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)));
            if (uVar3 == 0) {
              *(undefined1 *)&f_00->dfs = 0xff;
              f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
              local_24 = local_24 + 1;
            }
            else {
              *(byte *)&f_00->dfs = (byte)uVar3 & 0xf;
              *(undefined1 *)((long)&f_00->dfs + 1) = 0;
              if ((uVar3 & 0xf0) != 0) {
                if (((uVar3 & 0x80) != 0) &&
                   (iVar1 = dumbfile_getc((DUMBFILE *)
                                          CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)))
                   , iVar1 != 0)) {
                  *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 1;
                  *(char *)((long)&f_00->dfs + 2) = (char)iVar1 + -1;
                }
                if (((uVar3 & 0x40) != 0) &&
                   (iVar1 = dumbfile_getc((DUMBFILE *)
                                          CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)))
                   , iVar1 != 0)) {
                  *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 2;
                  *(char *)((long)&f_00->dfs + 3) = (char)iVar1;
                }
                if ((uVar3 & 0x20) != 0) {
                  *(byte *)((long)&f_00->dfs + 1) = *(byte *)((long)&f_00->dfs + 1) | 4;
                  iVar1 = dumbfile_getc((DUMBFILE *)
                                        CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)));
                  *(char *)((long)&f_00->dfs + 4) = (char)iVar1;
                }
                if ((uVar3 & 0x10) != 0) {
                  iVar1 = dumbfile_getc((DUMBFILE *)
                                        CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)));
                  value = dumbfile_getc((DUMBFILE *)
                                        CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa8)));
                  _dumb_it_xm_convert_effect(iVar1,value,(IT_ENTRY *)f_00,0);
                }
                if (*(char *)((long)&f_00->dfs + 1) != '\0') {
                  f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
                }
              }
            }
          }
          for (; local_24 < 0x40; local_24 = local_24 + 1) {
            *(undefined1 *)&f_00->dfs = 0xff;
            f_00 = (DUMBFILE *)((long)&f_00->dfs + 7);
          }
          in_RDI[1] = (int)(((long)f_00 - *(long *)(in_RDI + 2)) / 7);
          if (in_RDI[1] == 0) {
            local_4 = -1;
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = -1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int it_riff_dsmf_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len )
{
    int length, row;
	unsigned flags;
    long start, end;
    int p, q, r;
	IT_ENTRY * entry;

    length = dumbfile_igetw( f );
	if ( length > len ) return -1;

	len = length - 2;

	pattern->n_rows = 64;
	pattern->n_entries = 64;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < 64) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xF0;

		if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 1 );
            if (flags & 0x40) dumbfile_skip( f, 1 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
            if (flags & 0x10) dumbfile_skip( f, 2 );
		}
	}

	if ( pattern->n_entries == 64 ) return 0;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    if ( dumbfile_seek( f, start, DFS_SEEK_SET ) ) return -1;

    while ( ( row < 64 ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );
        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x0F;
		entry->mask = 0;

		if ( flags & 0xF0 )
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = q - 1;
				}
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
			}

			if ( flags & 0x20 )
			{
				entry->mask |= IT_ENTRY_VOLPAN;
                entry->volpan = dumbfile_getc( f );
			}

			if ( flags & 0x10 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( q, r, entry, 0 );
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < 64 )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}